

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O2

double __thiscall
units::detail::otherUsefulConversions<units::precise_unit,units::precise_unit>
          (detail *this,double val,precise_unit *start,precise_unit *result)

{
  bool bVar1;
  uint uVar2;
  unit_data uVar3;
  unit uVar4;
  unit *start_00;
  double dVar5;
  double __x;
  double __x_00;
  double in_XMM1_Qa;
  unit_data local_28;
  unit_data local_24;
  unit local_20;
  
  local_20.base_units_ = *(unit_data *)(this + 8);
  if ((((uint)start->base_units_ ^ (uint)local_20.base_units_) & 0x700) == 0) {
    local_28 = start->base_units_;
    local_24 = local_20.base_units_;
    uVar3 = unit_data::operator/(&local_24,&local_28);
    unit::pow((unit *)&units::s,__x,in_XMM1_Qa);
    uVar4 = unit::operator/((unit *)&units::m,&local_20);
    if ((((uint)uVar4.base_units_ ^ (uint)uVar3) & 0xfffffff) == 0) {
      dVar5 = (val * *(double *)this) / 9.80665;
    }
    else {
      local_24 = start->base_units_;
      local_28 = *(unit_data *)(this + 8);
      uVar3 = unit_data::operator/(&local_24,&local_28);
      unit::pow((unit *)&units::s,__x_00,in_XMM1_Qa);
      uVar4 = unit::operator/((unit *)&units::m,&local_20);
      if ((((uint)uVar4.base_units_ ^ (uint)uVar3) & 0xfffffff) != 0) {
        local_20.base_units_ = *(unit_data *)(this + 8);
        goto LAB_0017a959;
      }
      dVar5 = val * *(double *)this * 9.80665;
    }
    dVar5 = dVar5 / start->multiplier_;
  }
  else {
LAB_0017a959:
    local_20.multiplier_ = (float)*(double *)this;
    bVar1 = unit::operator==(&local_20,(unit *)&kilo);
    dVar5 = NAN;
    if (bVar1) {
      uVar2 = (uint)start->base_units_ & 0xfffffff;
      if (uVar2 == 1) {
        start_00 = (unit *)&km;
      }
      else {
        if (uVar2 != 0x100) {
          return NAN;
        }
        start_00 = (unit *)&kg;
      }
      dVar5 = convert<units::unit,units::precise_unit>(val,start_00,start);
    }
  }
  return dVar5;
}

Assistant:

inline double
        otherUsefulConversions(double val, const UX& start, const UX2& result)
    {
        if (start.base_units().kg() == result.base_units().kg()) {
            if ((start.base_units() / result.base_units())
                    .has_same_base((m / s.pow(2)).base_units())) {
                // weight to mass
                return val * start.multiplier() / constants::standard_gravity /
                    result.multiplier();
            }
            if ((result.base_units() / start.base_units())
                    .has_same_base((m / s.pow(2)).base_units())) {
                // mass to weight
                return val * start.multiplier() * constants::standard_gravity /
                    result.multiplier();
            }
        }
        if (unit_cast(start) == kilo) {
            if (result.has_same_base(kg)) {
                return convert(val, kg, result);
            }
            if (result.has_same_base(m)) {
                return convert(val, km, result);
            }
        }
        return constants::invalid_conversion;
    }